

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevent.cpp
# Opt level: O0

KeyboardModifiers __thiscall QKeyEvent::modifiers(QKeyEvent *this)

{
  long lVar1;
  int iVar2;
  QKeyEvent *in_RDI;
  long in_FS_OFFSET;
  KeyboardModifier in_stack_ffffffffffffffcc;
  undefined4 local_20;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = key(in_RDI);
  if (iVar2 == 0x1000020) {
    QInputEvent::modifiers(&in_RDI->super_QInputEvent);
    local_20 = (Int)QFlags<Qt::KeyboardModifier>::operator^
                              ((QFlags<Qt::KeyboardModifier> *)in_RDI,in_stack_ffffffffffffffcc);
  }
  else {
    iVar2 = key(in_RDI);
    if (iVar2 == 0x1000021) {
      QInputEvent::modifiers(&in_RDI->super_QInputEvent);
      local_20 = (Int)QFlags<Qt::KeyboardModifier>::operator^
                                ((QFlags<Qt::KeyboardModifier> *)in_RDI,in_stack_ffffffffffffffcc);
    }
    else {
      iVar2 = key(in_RDI);
      if (iVar2 == 0x1000023) {
        QInputEvent::modifiers(&in_RDI->super_QInputEvent);
        local_20 = (Int)QFlags<Qt::KeyboardModifier>::operator^
                                  ((QFlags<Qt::KeyboardModifier> *)in_RDI,in_stack_ffffffffffffffcc)
        ;
      }
      else {
        iVar2 = key(in_RDI);
        if (iVar2 == 0x1000022) {
          QInputEvent::modifiers(&in_RDI->super_QInputEvent);
          local_20 = (Int)QFlags<Qt::KeyboardModifier>::operator^
                                    ((QFlags<Qt::KeyboardModifier> *)in_RDI,
                                     in_stack_ffffffffffffffcc);
        }
        else {
          iVar2 = key(in_RDI);
          if (iVar2 == 0x1001103) {
            QInputEvent::modifiers(&in_RDI->super_QInputEvent);
            local_20 = (Int)QFlags<Qt::KeyboardModifier>::operator^
                                      ((QFlags<Qt::KeyboardModifier> *)in_RDI,
                                       in_stack_ffffffffffffffcc);
          }
          else {
            local_20 = (Int)QInputEvent::modifiers(&in_RDI->super_QInputEvent);
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
           (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)local_20;
  }
  __stack_chk_fail();
}

Assistant:

Qt::KeyboardModifiers QKeyEvent::modifiers() const
{
    if (key() == Qt::Key_Shift)
        return Qt::KeyboardModifiers(QInputEvent::modifiers()^Qt::ShiftModifier);
    if (key() == Qt::Key_Control)
        return Qt::KeyboardModifiers(QInputEvent::modifiers()^Qt::ControlModifier);
    if (key() == Qt::Key_Alt)
        return Qt::KeyboardModifiers(QInputEvent::modifiers()^Qt::AltModifier);
    if (key() == Qt::Key_Meta)
        return Qt::KeyboardModifiers(QInputEvent::modifiers()^Qt::MetaModifier);
    if (key() == Qt::Key_AltGr)
        return Qt::KeyboardModifiers(QInputEvent::modifiers()^Qt::GroupSwitchModifier);
    return QInputEvent::modifiers();
}